

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyz::ChNodeFEAxyz(ChNodeFEAxyz *this,ChVector<double> *initial_pos)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xe8);
  *(undefined ***)&(this->super_ChNodeFEAbase).field_0x18 = &PTR__ChLoadable_00b04a88;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2c278;
  *(undefined8 *)&this->field_0xe8 = 0xb2c378;
  ChNodeXYZ::ChNodeXYZ
            ((ChNodeXYZ *)&(this->super_ChNodeFEAbase).field_0x18,
             &PTR_construction_vtable_128__00b2c220,initial_pos);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb2be18;
  *(undefined8 *)&this->field_0xe8 = 0xb2c150;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0xb2bfb0;
  (this->super_ChVariableTupleCarrier_1vars<3>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x280);
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->X0).m_data[0] = initial_pos->m_data[0];
  (this->X0).m_data[1] = initial_pos->m_data[1];
  auVar1 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar1 = vblendps_avx(auVar1,ZEXT832((ulong)initial_pos->m_data[2]),3);
  auVar2._8_8_ = DAT_00b689a8;
  auVar2._0_8_ = DAT_00b689a8;
  auVar2._16_8_ = DAT_00b689a8;
  auVar2._24_8_ = DAT_00b689a8;
  auVar1 = vblendps_avx(auVar1,auVar2,0xc0);
  *(undefined1 (*) [32])((this->X0).m_data + 2) = auVar1;
  (this->variables).mass = 0.0;
  return;
}

Assistant:

ChNodeFEAxyz::ChNodeFEAxyz(ChVector<> initial_pos) : ChNodeXYZ(initial_pos), X0(initial_pos), Force(VNULL) {
    variables.SetNodeMass(0);
}